

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  undefined4 *in_RCX;
  int iVar5;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  char **in_R8;
  int found_prog_name;
  int i;
  int option_index;
  int optopt;
  int opterr;
  int optind;
  char *optarg;
  int check_ambiguity;
  int check_required;
  int initialize;
  int override;
  gengetopt_args_info local_args_info;
  int error_occurred;
  generic_list *molFraction_list;
  generic_list *shellRadius_list;
  int c;
  char *in_stack_fffffffffffffde8;
  short string_arg;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  char **in_stack_fffffffffffffdf8;
  cmdline_parser_arg_type in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  generic_list *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  generic_list **ppgVar10;
  gengetopt_args_info *args_info_00;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  void *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe90;
  cmdline_parser_arg_type in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  int local_78;
  int local_74;
  int local_4c;
  char *local_48;
  
  local_48 = (char *)0x0;
  local_4c = 0;
  package_name = (char *)*in_RSI;
  uVar13 = *in_RCX;
  iVar6 = in_RCX[1];
  iVar12 = in_RCX[2];
  uVar11 = in_RCX[3];
  if (iVar6 != 0) {
    cmdline_parser_init((gengetopt_args_info *)0x1412c2);
  }
  cmdline_parser_init((gengetopt_args_info *)0x1412cf);
  iVar8 = 0x3f;
  iVar5 = in_RCX[4];
  iVar9 = 0;
  ppgVar10 = (generic_list **)0x0;
LAB_001412f7:
  do {
    custom_optarg = (char *)ppgVar10;
    custom_optind = iVar9;
    custom_opterr = iVar5;
    custom_optopt = iVar8;
    iVar7 = 0;
    uVar1 = custom_getopt_long(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,
                               (char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                               ,(option *)in_stack_fffffffffffffde8,(int *)0x141350);
    if (uVar1 == 0xffffffff) {
      iVar6 = custom_optopt;
      iVar8 = custom_opterr;
      iVar5 = custom_optind;
      args_info_00 = (gengetopt_args_info *)custom_optarg;
      update_multiple_arg((void *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char ***)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                          in_stack_fffffffffffffe10,
                          (generic_value *)
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          in_stack_fffffffffffffe04,in_stack_fffffffffffffe30);
      update_multiple_arg((void *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char ***)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                          in_stack_fffffffffffffe10,
                          (generic_value *)
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          in_stack_fffffffffffffe04,in_stack_fffffffffffffe30);
      *(int *)(in_RDX + 0x110) = local_78 + *(int *)(in_RDX + 0x110);
      *(int *)(in_RDX + 0x114) = local_74 + *(int *)(in_RDX + 0x114);
      if (iVar12 != 0) {
        local_4c = cmdline_parser_required2
                             (args_info_00,(char *)CONCAT44(iVar5,iVar8),
                              (char *)CONCAT44(iVar6,iVar7));
      }
      cmdline_parser_release
                ((gengetopt_args_info *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      if (local_4c != 0) {
        return 1;
      }
      if (iVar5 < in_EDI) {
        iVar6 = 0;
        *(int *)(in_RDX + 0x130) = in_EDI - iVar5;
        pvVar3 = malloc((ulong)*(uint *)(in_RDX + 0x130) << 3);
        *(void **)(in_RDX + 0x128) = pvVar3;
        while (iVar5 < in_EDI) {
          iVar5 = iVar5 + 1;
          pcVar4 = gengetopt_strdup(local_48);
          *(char **)(*(long *)(in_RDX + 0x128) + (long)iVar6 * 8) = pcVar4;
          iVar6 = iVar6 + 1;
        }
      }
      return 0;
    }
    iVar8 = custom_optopt;
    iVar5 = custom_opterr;
    iVar9 = custom_optind;
    ppgVar10 = (generic_list **)custom_optarg;
    if (uVar1 == 0) {
      iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,"latticeConstant");
      if (iVar2 == 0) {
        in_stack_fffffffffffffde8 = (char *)0x0;
        in_stack_fffffffffffffdf0 = 2;
        in_stack_fffffffffffffdf8 =
             (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
        in_stack_fffffffffffffe08 = 0;
        in_stack_fffffffffffffe10 = 0;
        in_stack_fffffffffffffe18 = "latticeConstant";
        in_stack_fffffffffffffe20 = 0x2d;
        iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                           (uint *)CONCAT44(iVar12,uVar11),(uint *)ppgVar10,
                           (char *)CONCAT44(iVar9,iVar5),(char **)CONCAT44(iVar8,iVar7),
                           in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                           in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                           in_stack_fffffffffffffed0);
      }
      else {
        iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,"radius");
        if (iVar2 == 0) {
          in_stack_fffffffffffffde8 = (char *)0x0;
          in_stack_fffffffffffffdf0 = 2;
          in_stack_fffffffffffffdf8 =
               (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
          in_stack_fffffffffffffe08 = 0;
          in_stack_fffffffffffffe10 = 0;
          in_stack_fffffffffffffe18 = "radius";
          in_stack_fffffffffffffe20 = 0x2d;
          iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                             (uint *)CONCAT44(iVar12,uVar11),(uint *)ppgVar10,
                             (char *)CONCAT44(iVar9,iVar5),(char **)CONCAT44(iVar8,iVar7),
                             in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                             in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                             in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                             in_stack_fffffffffffffed0);
        }
        else {
          iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,"length");
          if (iVar2 == 0) {
            in_stack_fffffffffffffde8 = (char *)0x0;
            in_stack_fffffffffffffdf0 = 2;
            in_stack_fffffffffffffdf8 =
                 (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
            in_stack_fffffffffffffe08 = 0;
            in_stack_fffffffffffffe10 = 0;
            in_stack_fffffffffffffe18 = "length";
            in_stack_fffffffffffffe20 = 0x2d;
            iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                               (uint *)CONCAT44(iVar12,uVar11),(uint *)ppgVar10,
                               (char *)CONCAT44(iVar9,iVar5),(char **)CONCAT44(iVar8,iVar7),
                               in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                               in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                               in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                               in_stack_fffffffffffffed0);
          }
          else {
            iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,"shellRadius");
            if (iVar2 == 0) {
              in_stack_fffffffffffffde8 = "shellRadius";
              in_stack_fffffffffffffdf0 = 0x2d;
              in_stack_fffffffffffffdf8 = in_R8;
              iVar7 = update_multiple_arg_temp
                                (ppgVar10,(uint *)CONCAT44(iVar9,iVar5),
                                 (char *)CONCAT44(iVar8,iVar7),
                                 (char **)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48),
                                 (char *)CONCAT44(uVar1,in_stack_fffffffffffffe40),
                                 (cmdline_parser_arg_type)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                                 ,in_stack_fffffffffffffe90,(char)in_stack_fffffffffffffe98,
                                 (char *)CONCAT44(in_stack_fffffffffffffea4,
                                                  in_stack_fffffffffffffea0));
            }
            else {
              iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,"molFraction");
              if (iVar2 == 0) {
                in_stack_fffffffffffffde8 = "molFraction";
                in_stack_fffffffffffffdf0 = 0x2d;
                in_stack_fffffffffffffdf8 = in_R8;
                iVar7 = update_multiple_arg_temp
                                  (ppgVar10,(uint *)CONCAT44(iVar9,iVar5),
                                   (char *)CONCAT44(iVar8,iVar7),
                                   (char **)CONCAT44(in_stack_fffffffffffffe4c,
                                                     in_stack_fffffffffffffe48),
                                   (char *)CONCAT44(uVar1,in_stack_fffffffffffffe40),
                                   (cmdline_parser_arg_type)
                                   ((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                   in_stack_fffffffffffffe90,(char)in_stack_fffffffffffffe98,
                                   (char *)CONCAT44(in_stack_fffffffffffffea4,
                                                    in_stack_fffffffffffffea0));
              }
              else {
                iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,"vacancyPercent");
                if (iVar2 == 0) {
                  in_stack_fffffffffffffde8 = (char *)0x0;
                  in_stack_fffffffffffffdf0 = 2;
                  in_stack_fffffffffffffdf8 =
                       (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
                  in_stack_fffffffffffffe08 = 0;
                  in_stack_fffffffffffffe10 = 0;
                  in_stack_fffffffffffffe18 = "vacancyPercent";
                  in_stack_fffffffffffffe20 = 0x2d;
                  iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                                     (uint *)CONCAT44(iVar12,uVar11),(uint *)ppgVar10,
                                     (char *)CONCAT44(iVar9,iVar5),(char **)CONCAT44(iVar8,iVar7),
                                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                                     in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                                     in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                                     in_stack_fffffffffffffed0);
                }
                else {
                  iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,
                                 "vacancyInnerRadius");
                  if (iVar2 == 0) {
                    in_stack_fffffffffffffde8 = (char *)0x0;
                    in_stack_fffffffffffffdf0 = 2;
                    in_stack_fffffffffffffdf8 =
                         (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
                    in_stack_fffffffffffffe08 = 0;
                    in_stack_fffffffffffffe10 = 0;
                    in_stack_fffffffffffffe18 = "vacancyInnerRadius";
                    in_stack_fffffffffffffe20 = 0x2d;
                    iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                                       (uint *)CONCAT44(iVar12,uVar11),(uint *)ppgVar10,
                                       (char *)CONCAT44(iVar9,iVar5),(char **)CONCAT44(iVar8,iVar7),
                                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                                       in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                                       in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                                       in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                                       in_stack_fffffffffffffed0);
                  }
                  else {
                    iVar2 = strcmp(cmdline_parser_internal::long_options[iVar7].name,
                                   "vacancyOuterRadius");
                    if (iVar2 != 0) goto LAB_001412f7;
                    in_stack_fffffffffffffde8 = (char *)0x0;
                    in_stack_fffffffffffffdf0 = 2;
                    in_stack_fffffffffffffdf8 =
                         (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
                    in_stack_fffffffffffffe08 = 0;
                    in_stack_fffffffffffffe10 = 0;
                    in_stack_fffffffffffffe18 = "vacancyOuterRadius";
                    in_stack_fffffffffffffe20 = 0x2d;
                    iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                                       (uint *)CONCAT44(iVar12,uVar11),(uint *)ppgVar10,
                                       (char *)CONCAT44(iVar9,iVar5),(char **)CONCAT44(iVar8,iVar7),
                                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                                       in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                                       in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                                       in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                                       in_stack_fffffffffffffed0);
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      if (uVar1 == 0x3f) goto LAB_00141d78;
      if (uVar1 == 0x56) {
        cmdline_parser_print_version();
        cmdline_parser_free((gengetopt_args_info *)0x141403);
        exit(0);
      }
      if (uVar1 == 0x68) {
        cmdline_parser_print_help();
        cmdline_parser_free((gengetopt_args_info *)0x1413ea);
        exit(0);
      }
      if (uVar1 != 0x6f) {
        if (in_R8 == (char **)0x0) {
          in_R8 = (char **)0x434983;
        }
        fprintf(_stderr,"%s: option unknown: %c%s\n","nanorod_pentBuilder",(ulong)uVar1,in_R8);
        abort();
      }
      in_stack_fffffffffffffde8 = (char *)0x0;
      in_stack_fffffffffffffdf0 = 1;
      in_stack_fffffffffffffdf8 =
           (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),uVar11);
      in_stack_fffffffffffffe08 = 0;
      in_stack_fffffffffffffe10 = 0;
      in_stack_fffffffffffffe18 = "output";
      in_stack_fffffffffffffe20 = 0x6f;
      iVar7 = update_arg(in_stack_fffffffffffffe78,(char **)CONCAT44(uVar13,iVar6),
                         (uint *)CONCAT44(iVar12,uVar11),(uint *)custom_optarg,
                         (char *)CONCAT44(custom_optind,custom_opterr),
                         (char **)CONCAT44(custom_optopt,iVar7),in_stack_fffffffffffffe90,
                         in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
    }
    if (iVar7 != 0) {
LAB_00141d78:
      string_arg = (short)((ulong)in_stack_fffffffffffffde8 >> 0x30);
      free_list((generic_list *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                string_arg);
      free_list((generic_list *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                string_arg);
      cmdline_parser_release
                ((gengetopt_args_info *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      return 1;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * shellRadius_list = NULL;
  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "latticeConstant",	1, NULL, 0 },
        { "radius",	1, NULL, 0 },
        { "length",	1, NULL, 0 },
        { "shellRadius",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "vacancyPercent",	1, NULL, 0 },
        { "vacancyInnerRadius",	1, NULL, 0 },
        { "vacancyOuterRadius",	1, NULL, 0 },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* Lattice spacing in Angstroms for cubic lattice..  */
          if (strcmp (long_options[option_index].name, "latticeConstant") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->latticeConstant_arg), 
                 &(args_info->latticeConstant_orig), &(args_info->latticeConstant_given),
                &(local_args_info.latticeConstant_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "latticeConstant", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod radius in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "radius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->radius_arg), 
                 &(args_info->radius_orig), &(args_info->radius_given),
                &(local_args_info.radius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "radius", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod length in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "length") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->length_arg), 
                 &(args_info->length_orig), &(args_info->length_given),
                &(local_args_info.length_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "length", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius containing within it only molecules of a specific component. Specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "shellRadius") == 0)
          {
          
            if (update_multiple_arg_temp(&shellRadius_list, 
                &(local_args_info.shellRadius_given), optarg, 0, 0, ARG_DOUBLE,
                "shellRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Builds a multi-component random alloy nanoparticle. A mole Fraction must be specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          /* Percentage of atoms to remove from within vacancy range.  */
          else if (strcmp (long_options[option_index].name, "vacancyPercent") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyPercent_arg), 
                 &(args_info->vacancyPercent_orig), &(args_info->vacancyPercent_given),
                &(local_args_info.vacancyPercent_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyPercent", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyInnerRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyInnerRadius_arg), 
                 &(args_info->vacancyInnerRadius_orig), &(args_info->vacancyInnerRadius_given),
                &(local_args_info.vacancyInnerRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyInnerRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyOuterRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyOuterRadius_arg), 
                 &(args_info->vacancyOuterRadius_orig), &(args_info->vacancyOuterRadius_given),
                &(local_args_info.vacancyOuterRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyOuterRadius", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->shellRadius_arg),
    &(args_info->shellRadius_orig), args_info->shellRadius_given,
    local_args_info.shellRadius_given, 0,
    ARG_DOUBLE, shellRadius_list);
  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->shellRadius_given += local_args_info.shellRadius_given;
  local_args_info.shellRadius_given = 0;
  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (shellRadius_list, 0 );
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}